

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O1

REF_STATUS
ref_phys_yplus_lengthscale
          (REF_GRID ref_grid,REF_DBL mach,REF_DBL re,REF_DBL reference_t_k,REF_INT ldim,
          REF_DBL *field,REF_DBL *lengthscale)

{
  int *piVar1;
  REF_NODE ref_node;
  REF_GLOB *pRVar2;
  REF_DBL *pRVar3;
  bool bVar4;
  REF_INT RVar5;
  REF_STATUS RVar6;
  uint uVar7;
  void *__ptr;
  long lVar8;
  long lVar9;
  undefined8 uVar10;
  uint unaff_EBP;
  REF_CELL ref_cell;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  int iVar14;
  REF_GRID ref_grid_00;
  int iVar15;
  double y;
  double u;
  REF_INT ntri;
  REF_DBL tangent [3];
  REF_DBL yplus_dist;
  REF_INT tri_list [2];
  REF_DBL edg_norm [3];
  REF_INT edg_nodes [27];
  REF_INT tri_nodes [27];
  int local_1ac;
  REF_CELL local_1a8;
  REF_GRID local_1a0;
  double local_198;
  double local_190;
  double local_188;
  REF_DBL *local_178;
  REF_CELL local_170;
  long local_168;
  REF_DBL local_160;
  REF_DBL local_158;
  REF_DBL local_150;
  double local_148;
  REF_INT local_140 [2];
  double local_138;
  double local_130;
  double local_128;
  REF_INT local_118;
  REF_INT local_114;
  int local_a8;
  int local_a4;
  int local_a0;
  
  ref_node = ref_grid->node;
  iVar14 = ref_node->max;
  lVar11 = (long)iVar14;
  if (0 < lVar11) {
    pRVar2 = ref_node->global;
    lVar8 = 0;
    do {
      if (-1 < pRVar2[lVar8]) {
        lengthscale[lVar8] = 0.0;
      }
      lVar8 = lVar8 + 1;
    } while (lVar11 != lVar8);
  }
  local_1a0 = ref_grid;
  local_160 = mach;
  local_158 = re;
  local_150 = reference_t_k;
  if (iVar14 < 0) {
    unaff_EBP = 1;
    pcVar13 = "malloc hits of REF_INT negative";
  }
  else {
    __ptr = malloc(lVar11 << 2);
    if (__ptr != (void *)0x0) {
      bVar4 = true;
      if (0 < ref_node->max) {
        lVar11 = 0;
        do {
          *(undefined4 *)((long)__ptr + lVar11 * 4) = 0;
          lVar11 = lVar11 + 1;
        } while (lVar11 < ref_node->max);
      }
      goto LAB_001a8c28;
    }
    unaff_EBP = 2;
    pcVar13 = "malloc hits of REF_INT NULL";
  }
  bVar4 = false;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x2fc,
         "ref_phys_yplus_lengthscale",pcVar13);
  __ptr = (void *)0x0;
LAB_001a8c28:
  if (!bVar4) {
    return unaff_EBP;
  }
  if (local_1a0->twod == 0) {
    pcVar13 = "implement 3D";
    uVar7 = 6;
    uVar10 = 0x332;
    uVar12 = 6;
  }
  else {
    ref_cell = local_1a0->cell[0];
    bVar4 = 0 < ref_cell->max;
    local_1a8 = ref_cell;
    if (0 < ref_cell->max) {
      local_170 = local_1a0->cell[3];
      iVar14 = 0;
      ref_grid_00 = local_1a0;
      local_178 = field;
      uVar7 = unaff_EBP;
      do {
        RVar6 = ref_cell_nodes(ref_cell,iVar14,&local_118);
        unaff_EBP = uVar7;
        if (RVar6 == 0) {
          unaff_EBP = ref_layer_interior_seg_normal(ref_grid_00,iVar14,&local_138);
          if (unaff_EBP != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x309,"ref_phys_yplus_lengthscale",(ulong)unaff_EBP,"edge norm");
            break;
          }
          unaff_EBP = ref_cell_list_with2(ref_grid_00->cell[3],local_118,local_114,2,&local_1ac,
                                          local_140);
          iVar15 = local_1ac;
          if (unaff_EBP != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x30c,"ref_phys_yplus_lengthscale",(ulong)unaff_EBP,"tri with2");
            break;
          }
          if ((long)local_1ac != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x30d,"ref_phys_yplus_lengthscale","edg expects one tri",1,(long)local_1ac);
            uVar7 = 1;
          }
          unaff_EBP = uVar7;
          if (iVar15 != 1) break;
          unaff_EBP = ref_cell_nodes(local_170,local_140[0],&local_a8);
          RVar5 = local_118;
          if (unaff_EBP != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x30f,"ref_phys_yplus_lengthscale",(ulong)unaff_EBP,"tri nodes");
            break;
          }
          lVar11 = (long)local_118;
          local_168 = (long)local_114;
          iVar15 = (local_a8 - local_118) + local_a4 + local_a0;
          pRVar3 = ref_node->real;
          local_198 = pRVar3[local_168 * 0xf] - pRVar3[lVar11 * 0xf];
          local_190 = pRVar3[local_168 * 0xf + 1] - pRVar3[lVar11 * 0xf + 1];
          local_188 = pRVar3[local_168 * 0xf + 2] - pRVar3[lVar11 * 0xf + 2];
          unaff_EBP = ref_math_normalize(&local_198);
          if (unaff_EBP != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x319,"ref_phys_yplus_lengthscale",(ulong)unaff_EBP,"normalize tangent");
            break;
          }
          iVar15 = iVar15 - (int)local_168;
          lVar8 = (long)(iVar15 * ldim);
          pRVar3 = ref_node->real;
          lVar9 = (long)(iVar15 * 0xf);
          u = 0.0 - (local_178[lVar8 + 3] * local_188 +
                    local_178[lVar8 + 1] * local_198 + local_190 * local_178[lVar8 + 2]);
          if (u <= -u) {
            u = -u;
          }
          y = (pRVar3[lVar9 + 2] - pRVar3[lVar11 * 0xf + 2]) * local_128 +
              (pRVar3[lVar9] - pRVar3[lVar11 * 0xf]) * local_138 +
              (pRVar3[lVar9 + 1] - pRVar3[lVar11 * 0xf + 1]) * local_130;
          if (y <= -y) {
            y = -y;
          }
          unaff_EBP = ref_phys_yplus_dist(local_160,local_158,local_150,local_178[RVar5 * ldim],
                                          (local_178[(long)(RVar5 * ldim) + 4] /
                                          local_178[RVar5 * ldim]) * 1.4,y,u,&local_148);
          if (unaff_EBP != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x32b,"ref_phys_yplus_lengthscale",(ulong)unaff_EBP,"yplus dist");
            break;
          }
          lVar11 = (long)local_118;
          lengthscale[lVar11] = lengthscale[lVar11] + local_148;
          piVar1 = (int *)((long)__ptr + lVar11 * 4);
          *piVar1 = *piVar1 + 1;
          lVar11 = (long)local_114;
          lengthscale[lVar11] = local_148 + lengthscale[lVar11];
          piVar1 = (int *)((long)__ptr + lVar11 * 4);
          *piVar1 = *piVar1 + 1;
          ref_cell = local_1a8;
          ref_grid_00 = local_1a0;
          unaff_EBP = uVar7;
        }
        iVar14 = iVar14 + 1;
        bVar4 = iVar14 < ref_cell->max;
        uVar7 = unaff_EBP;
      } while (iVar14 < ref_cell->max);
    }
    if (bVar4) {
      return unaff_EBP;
    }
    iVar14 = ref_node->max;
    if (0 < (long)iVar14) {
      pRVar2 = ref_node->global;
      lVar11 = 0;
      do {
        if ((-1 < pRVar2[lVar11]) && (iVar15 = *(int *)((long)__ptr + lVar11 * 4), 0 < iVar15)) {
          lengthscale[lVar11] = lengthscale[lVar11] / (double)iVar15;
        }
        lVar11 = lVar11 + 1;
      } while (iVar14 != lVar11);
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    uVar7 = ref_node_ghost_dbl(ref_node,lengthscale,1);
    if (uVar7 == 0) {
      return 0;
    }
    pcVar13 = "ghost lengthscale";
    uVar10 = 0x33b;
    uVar12 = (ulong)uVar7;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar10,
         "ref_phys_yplus_lengthscale",uVar12,pcVar13);
  return uVar7;
}

Assistant:

REF_FCN REF_STATUS ref_phys_yplus_lengthscale(REF_GRID ref_grid, REF_DBL mach,
                                              REF_DBL re, REF_DBL reference_t_k,
                                              REF_INT ldim, REF_DBL *field,
                                              REF_DBL *lengthscale) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT *hits;
  REF_INT node;
  each_ref_node_valid_node(ref_node, node) { lengthscale[node] = 0.0; }
  ref_malloc_init(hits, ref_node_max(ref_node), REF_INT, 0);
  if (ref_grid_twod(ref_grid)) {
    REF_CELL edg_cell = ref_grid_edg(ref_grid);
    REF_CELL tri_cell = ref_grid_tri(ref_grid);
    REF_INT edg, tri;
    REF_INT edg_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT ntri, tri_list[2];
    REF_INT off_node, on_node;
    REF_DBL dn, du, u0, u1, dxyz[3], edg_norm[3], tangent[3];
    REF_DBL rho, t, yplus_dist;
    REF_DBL gamma = 1.4, press;
    each_ref_cell_valid_cell_with_nodes(edg_cell, edg, edg_nodes) {
      RSS(ref_layer_interior_seg_normal(ref_grid, edg, edg_norm), "edge norm");
      RSS(ref_cell_list_with2(ref_grid_tri(ref_grid), edg_nodes[0],
                              edg_nodes[1], 2, &ntri, tri_list),
          "tri with2");
      REIS(1, ntri, "edg expects one tri");
      tri = tri_list[0];
      RSS(ref_cell_nodes(tri_cell, tri, tri_nodes), "tri nodes");
      on_node = edg_nodes[0];
      off_node = tri_nodes[0] + tri_nodes[1] + tri_nodes[2] - edg_nodes[0] -
                 edg_nodes[1];
      tangent[0] = ref_node_xyz(ref_node, 0, edg_nodes[1]) -
                   ref_node_xyz(ref_node, 0, edg_nodes[0]);
      tangent[1] = ref_node_xyz(ref_node, 1, edg_nodes[1]) -
                   ref_node_xyz(ref_node, 1, edg_nodes[0]);
      tangent[2] = ref_node_xyz(ref_node, 2, edg_nodes[1]) -
                   ref_node_xyz(ref_node, 2, edg_nodes[0]);
      RSS(ref_math_normalize(tangent), "normalize tangent");

      u0 = ref_math_dot(&(field[1 + ldim * on_node]), tangent);
      u1 = ref_math_dot(&(field[1 + ldim * off_node]), tangent);
      u0 = 0.0; /* assume no-slip bc */
      dxyz[0] = ref_node_xyz(ref_node, 0, off_node) -
                ref_node_xyz(ref_node, 0, on_node);
      dxyz[1] = ref_node_xyz(ref_node, 1, off_node) -
                ref_node_xyz(ref_node, 1, on_node);
      dxyz[2] = ref_node_xyz(ref_node, 2, off_node) -
                ref_node_xyz(ref_node, 2, on_node);
      du = ABS(u0 - u1);
      dn = ABS(ref_math_dot(dxyz, edg_norm));
      rho = field[0 + ldim * on_node];
      press = field[4 + ldim * on_node];
      t = gamma * (press / rho);
      RSS(ref_phys_yplus_dist(mach, re, reference_t_k, rho, t, dn, du,
                              &yplus_dist),
          "yplus dist");
      lengthscale[edg_nodes[0]] += yplus_dist;
      hits[edg_nodes[0]] += 1;
      lengthscale[edg_nodes[1]] += yplus_dist;
      hits[edg_nodes[1]] += 1;
    }
  } else {
    RSS(REF_IMPLEMENT, "implement 3D");
  }
  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      lengthscale[node] /= (REF_DBL)hits[node];
    }
  }
  ref_free(hits);

  RSS(ref_node_ghost_dbl(ref_node, lengthscale, 1), "ghost lengthscale");

  return REF_SUCCESS;
}